

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_dump.h
# Opt level: O1

void dumpToken(KonohaContext *kctx,kToken *tk,int n)

{
  uint uVar1;
  _func_int_char_ptr_varargs *UNRECOVERED_JUMPTABLE_00;
  undefined8 uVar2;
  _func_uintptr_t_KonohaContext_ptr_kObject_ptr *p_Var3;
  char *pcVar4;
  kString *pkVar5;
  uintptr_t uVar6;
  
  if (verbose_sugar == 0) {
    return;
  }
  if (n < 0) {
    n = (int)(short)tk->uline;
  }
  UNRECOVERED_JUMPTABLE_00 = kctx->platApi->printf_i;
  pcVar4 = kToken_t(kctx,tk);
  uVar2 = *(undefined8 *)
           (KSymbol_prefixText_prefixes + (ulong)((tk->field_3).tokenType >> 0x1d) * 8);
  pkVar5 = KSymbol_GetString(kctx,(tk->field_3).tokenType);
  p_Var3 = ((pkVar5->h).ct)->unbox;
  pkVar5 = KSymbol_GetString(kctx,(tk->field_3).tokenType);
  uVar6 = (*p_Var3)(kctx,(kObject_conflict *)pkVar5);
  (*UNRECOVERED_JUMPTABLE_00)("Token[%d] \'%s\' TokenType=%s%s",(ulong)(uint)n,pcVar4,uVar2,uVar6);
  if ((tk->field_3).tokenType == 0xe0000001) {
    (*kctx->platApi->printf_i)(" indent=+%d",(ulong)(tk->field_4).indent);
  }
  uVar1 = tk->symbol;
  if (uVar1 != 0) {
    UNRECOVERED_JUMPTABLE_00 = kctx->platApi->printf_i;
    uVar2 = *(undefined8 *)(KSymbol_prefixText_prefixes + (ulong)(uVar1 >> 0x1d) * 8);
    pkVar5 = KSymbol_GetString(kctx,uVar1);
    p_Var3 = ((pkVar5->h).ct)->unbox;
    pkVar5 = KSymbol_GetString(kctx,tk->symbol);
    uVar6 = (*p_Var3)(kctx,(kObject_conflict *)pkVar5);
    (*UNRECOVERED_JUMPTABLE_00)(" Symbol=%s%s",uVar2,uVar6);
  }
  if ((tk->resolvedSyntaxInfo == (kSyntax *)0x0) || (tk->resolvedSyntaxInfo->keyword != 0xe0000006))
  {
    uVar1 = (tk->field_6).ruleNameSymbol;
    if (uVar1 != 0) {
      UNRECOVERED_JUMPTABLE_00 = kctx->platApi->printf_i;
      uVar2 = *(undefined8 *)(KSymbol_prefixText_prefixes + (ulong)(uVar1 >> 0x1d) * 8);
      pkVar5 = KSymbol_GetString(kctx,uVar1);
      p_Var3 = ((pkVar5->h).ct)->unbox;
      pkVar5 = KSymbol_GetString(kctx,(tk->field_6).ruleNameSymbol);
      uVar6 = (*p_Var3)(kctx,(kObject_conflict *)pkVar5);
      (*UNRECOVERED_JUMPTABLE_00)(" ruleNameSymbol=%s%s",uVar2,uVar6);
    }
  }
  else {
    UNRECOVERED_JUMPTABLE_00 = kctx->platApi->printf_i;
    pkVar5 = KType_GetString(kctx,(tk->field_6).resolvedTypeId & 0xfffffff);
    p_Var3 = ((pkVar5->h).ct)->unbox;
    pkVar5 = KType_GetString(kctx,(tk->field_6).resolvedTypeId & 0xfffffff);
    uVar6 = (*p_Var3)(kctx,(kObject_conflict *)pkVar5);
    (*UNRECOVERED_JUMPTABLE_00)(" resolvedType=%s",uVar6);
  }
  UNRECOVERED_JUMPTABLE_00 = kctx->platApi->printf_i;
  if (tk->resolvedSyntaxInfo != (kSyntax *)0x0) {
    uVar1 = tk->resolvedSyntaxInfo->keyword;
    uVar2 = *(undefined8 *)(KSymbol_prefixText_prefixes + (ulong)(uVar1 >> 0x1d) * 8);
    pkVar5 = KSymbol_GetString(kctx,uVar1);
    p_Var3 = ((pkVar5->h).ct)->unbox;
    pkVar5 = KSymbol_GetString(kctx,tk->resolvedSyntaxInfo->keyword);
    uVar6 = (*p_Var3)(kctx,(kObject_conflict *)pkVar5);
    (*UNRECOVERED_JUMPTABLE_00)(" Syntax=%s%s\n",uVar2,uVar6,UNRECOVERED_JUMPTABLE_00);
    return;
  }
  (*UNRECOVERED_JUMPTABLE_00)(" Syntax=NULL\n");
  return;
}

Assistant:

static void dumpToken(KonohaContext *kctx, kToken *tk, int n)
{
	if(verbose_sugar) {
		if(n < 0) n = (short) tk->uline;
		DUMP_P("Token[%d] '%s' TokenType=%s%s", n, KToken_t(tk), KSymbol_Fmt2(tk->tokenType));
		if(kToken_IsIndent(tk)) {
			DUMP_P(" indent=+%d", tk->indent);
		}
		if(tk->symbol > 0) {
			DUMP_P(" Symbol=%s%s", KSymbol_Fmt2(tk->symbol));
		}
		if(tk->resolvedSyntaxInfo != NULL && tk->resolvedSyntaxInfo->keyword == KSymbol_TypePattern) {
			DUMP_P(" resolvedType=%s", KType_text(tk->resolvedTypeId));
		}else {
			if(tk->ruleNameSymbol > 0) {
				DUMP_P(" ruleNameSymbol=%s%s", KSymbol_Fmt2(tk->ruleNameSymbol));
			}
		}
		if(tk->resolvedSyntaxInfo == NULL) {
			DUMP_P(" Syntax=NULL\n");
		}
		else {
			DUMP_P(" Syntax=%s%s\n", KSymbol_Fmt2(tk->resolvedSyntaxInfo->keyword));
		}
	}
}